

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# histo.c
# Opt level: O0

int fits_get_col_minmax(fitsfile *fptr,int colnum,double *datamin,double *datamax,int *status)

{
  double *in_RCX;
  double *in_RDX;
  int *in_R8;
  double nulval;
  double array [1000];
  long ii;
  long firstrow;
  long ntodo;
  long nrows;
  int anynul;
  int *in_stack_ffffffffffffe040;
  char *in_stack_ffffffffffffe048;
  double dVar1;
  void *in_stack_ffffffffffffe050;
  char *in_stack_ffffffffffffe058;
  long lVar2;
  undefined8 in_stack_ffffffffffffe060;
  double nelem;
  fitsfile *in_stack_ffffffffffffe068;
  LONGLONG in_stack_ffffffffffffe070;
  int in_stack_ffffffffffffe078;
  int in_stack_ffffffffffffe07c;
  fitsfile *in_stack_ffffffffffffe080;
  void *in_stack_ffffffffffffe0b0;
  void *in_stack_ffffffffffffe0b8;
  int *in_stack_ffffffffffffe0c0;
  int *in_stack_ffffffffffffe0c8;
  long local_58;
  long local_40;
  
  ffgky(in_stack_ffffffffffffe068,(int)((ulong)in_stack_ffffffffffffe060 >> 0x20),
        in_stack_ffffffffffffe058,in_stack_ffffffffffffe050,in_stack_ffffffffffffe048,
        in_stack_ffffffffffffe040);
  nelem = -9.1191291391491e-36;
  *in_RDX = 9e+36;
  *in_RCX = -9e+36;
  for (; local_40 != 0; local_40 = local_40 - lVar2) {
    lVar2 = local_40;
    if (99 < local_40) {
      lVar2 = 100;
    }
    ffgcv(in_stack_ffffffffffffe080,in_stack_ffffffffffffe07c,in_stack_ffffffffffffe078,
          in_stack_ffffffffffffe070,(LONGLONG)in_stack_ffffffffffffe068,(LONGLONG)nelem,
          in_stack_ffffffffffffe0b0,in_stack_ffffffffffffe0b8,in_stack_ffffffffffffe0c0,
          in_stack_ffffffffffffe0c8);
    for (local_58 = 0; local_58 < lVar2; local_58 = local_58 + 1) {
      if ((*(double *)(&stack0xffffffffffffe068 + local_58 * 8) != nelem) ||
         (NAN(*(double *)(&stack0xffffffffffffe068 + local_58 * 8)) || NAN(nelem))) {
        if (*(double *)(&stack0xffffffffffffe068 + local_58 * 8) <= *in_RDX) {
          dVar1 = *(double *)(&stack0xffffffffffffe068 + local_58 * 8);
        }
        else {
          dVar1 = *in_RDX;
        }
        *in_RDX = dVar1;
        if (*in_RCX < *(double *)(&stack0xffffffffffffe068 + local_58 * 8) ||
            *in_RCX == *(double *)(&stack0xffffffffffffe068 + local_58 * 8)) {
          dVar1 = *(double *)(&stack0xffffffffffffe068 + local_58 * 8);
        }
        else {
          dVar1 = *in_RCX;
        }
        *in_RCX = dVar1;
      }
    }
  }
  return *in_R8;
}

Assistant:

int fits_get_col_minmax(fitsfile *fptr, int colnum, double *datamin, 
			double *datamax, int *status)
/* 
   Simple utility routine to compute the min and max value in a column
*/
{
    int anynul;
    long nrows, ntodo, firstrow, ii;
    double array[1000], nulval;

    ffgky(fptr, TLONG, "NAXIS2", &nrows, NULL, status); /* no. of rows */

    firstrow = 1;
    nulval = DOUBLENULLVALUE;
    *datamin =  9.0E36;
    *datamax = -9.0E36;

    while(nrows)
    {
        ntodo = minvalue(nrows, 100);
        ffgcv(fptr, TDOUBLE, colnum, firstrow, 1, ntodo, &nulval, array,
              &anynul, status);

        for (ii = 0; ii < ntodo; ii++)
        {
            if (array[ii] != nulval)
            {
                *datamin = minvalue(*datamin, array[ii]);
                *datamax = maxvalue(*datamax, array[ii]);
            }
        }

        nrows -= ntodo;
        firstrow += ntodo;
    }
    return(*status);
}